

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.h
# Opt level: O1

bool __thiscall
GenericFunctionInstanceTypeRequest::operator==
          (GenericFunctionInstanceTypeRequest *this,GenericFunctionInstanceTypeRequest *rhs)

{
  bool bVar1;
  TypeHandle *pTVar2;
  TypeHandle *pTVar3;
  MatchData *pMVar4;
  MatchData *pMVar5;
  
  if ((this->parentType == rhs->parentType) && (this->function == rhs->function)) {
    pTVar2 = (rhs->arguments).head;
    pTVar3 = (this->arguments).head;
    bVar1 = pTVar3 != (TypeHandle *)0x0 || pTVar2 != (TypeHandle *)0x0;
    if ((pTVar2 != (TypeHandle *)0x0 && pTVar3 != (TypeHandle *)0x0) &&
       (pTVar3->type == pTVar2->type)) {
      do {
        pTVar2 = pTVar2->next;
        pTVar3 = pTVar3->next;
        if ((pTVar3 == (TypeHandle *)0x0) || (pTVar2 == (TypeHandle *)0x0)) break;
      } while (pTVar3->type == pTVar2->type);
      bVar1 = pTVar3 != (TypeHandle *)0x0 || pTVar2 != (TypeHandle *)0x0;
    }
    if (!bVar1) {
      pMVar4 = (rhs->aliases).head;
      pMVar5 = (this->aliases).head;
      bVar1 = pMVar5 != (MatchData *)0x0 || pMVar4 != (MatchData *)0x0;
      if (pMVar4 != (MatchData *)0x0 && pMVar5 != (MatchData *)0x0) {
        while ((pMVar5->name == pMVar4->name && (pMVar5->type == pMVar4->type))) {
          pMVar4 = pMVar4->next;
          pMVar5 = pMVar5->next;
          bVar1 = pMVar5 != (MatchData *)0x0 || pMVar4 != (MatchData *)0x0;
          if ((pMVar5 == (MatchData *)0x0) || (pMVar4 == (MatchData *)0x0)) break;
        }
      }
      return (bool)(bVar1 ^ 1);
    }
  }
  return false;
}

Assistant:

bool operator==(const GenericFunctionInstanceTypeRequest& rhs) const
	{
		if(parentType != rhs.parentType)
			return false;

		if(function != rhs.function)
			return false;

		for(TypeHandle *leftArg = arguments.head, *rightArg = rhs.arguments.head; leftArg || rightArg; leftArg = leftArg->next, rightArg = rightArg->next)
		{
			if(!leftArg || !rightArg)
				return false;

			if(leftArg->type != rightArg->type)
				return false;
		}

		for(MatchData *leftAlias = aliases.head, *rightAlias = rhs.aliases.head; leftAlias || rightAlias; leftAlias = leftAlias->next, rightAlias = rightAlias->next)
		{
			if(!leftAlias || !rightAlias)
				return false;

			if(leftAlias->name != rightAlias->name || leftAlias->type != rightAlias->type)
				return false;
		}

		return true;
	}